

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int received_set_section_offset(RECEIVED_HANDLE received,uint64_t section_offset_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  RECEIVED_INSTANCE *received_instance;
  
  if (received == (RECEIVED_HANDLE)0x0) {
    iVar2 = 0x4451;
  }
  else {
    item_value = amqpvalue_create_ulong(section_offset_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x4459;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(received->composite_value,1,item_value);
      iVar2 = 0x445f;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int received_set_section_offset(RECEIVED_HANDLE received, uint64_t section_offset_value)
{
    int result;

    if (received == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received;
        AMQP_VALUE section_offset_amqp_value = amqpvalue_create_ulong(section_offset_value);
        if (section_offset_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(received_instance->composite_value, 1, section_offset_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(section_offset_amqp_value);
        }
    }

    return result;
}